

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_1.c
# Opt level: O2

void write_packet(rfc5444_writer *w,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  autobuf out;
  
  uVar4 = 0;
  while (uVar4 < length) {
    printf("%04zx:",uVar4);
    uVar1 = uVar4 + 0x20;
    uVar5 = uVar1;
    if (length < uVar1) {
      uVar5 = length;
    }
    for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      pcVar3 = "";
      if ((uVar4 & 3) == 0) {
        pcVar3 = " ";
      }
      printf("%s%02x",pcVar3,(ulong)*(byte *)((long)buffer + uVar4));
    }
    putchar(10);
    uVar4 = uVar1;
  }
  putchar(10);
  abuf_init(&out);
  rfc5444_print_direct(&out,buffer,length);
  puts(out._buf);
  abuf_free(&out);
  cunit_named_check(length == 0x29,"write_packet",0xcb,"Result has wrong length: %zu != %zu",length,
                    0x29);
  if (length == 0x29) {
    iVar2 = bcmp(result,buffer,0x29);
    cunit_named_check(iVar2 == 0,"write_packet",0xcd,"Result differs from pattern");
  }
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *w __attribute__ ((unused)),
    struct rfc5444_writer_target *iface __attribute__((unused)),
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;
  struct autobuf out;

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+32; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");

  abuf_init(&out);
  rfc5444_print_direct(&out, buf, length);

  printf("%s\n", abuf_getptr(&out));
  abuf_free(&out);

  CHECK_TRUE(length == sizeof(result), "Result has wrong length: %zu != %zu", length, sizeof(result));
  if (length == sizeof(result)) {
    CHECK_TRUE(memcmp(result, buffer, sizeof(result)) == 0, "Result differs from pattern");
  }
}